

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O3

void SetInitialProfiles(N_Vector cc,N_Vector sc)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  sunrealtype stemp [6];
  sunrealtype ctemp [6];
  
  lVar1 = 0;
  do {
    ctemp[lVar1] = 1.0;
    stemp[lVar1] = 1.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 3;
  do {
    ctemp[lVar1] = 30000.0;
    stemp[lVar1] = 1e-05;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 6);
  lVar1 = *(long *)((long)cc->content + 0x10);
  lVar2 = *(long *)((long)sc->content + 0x10);
  lVar3 = 0;
  do {
    lVar6 = 0;
    lVar4 = lVar1;
    lVar5 = lVar2;
    do {
      lVar7 = 0;
      do {
        *(sunrealtype *)(lVar4 + lVar7 * 8) = ctemp[lVar7];
        *(sunrealtype *)(lVar5 + lVar7 * 8) = stemp[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x30;
      lVar4 = lVar4 + 0x30;
    } while (lVar6 != 8);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0x180;
    lVar1 = lVar1 + 0x180;
  } while (lVar3 != 8);
  return;
}

Assistant:

static void SetInitialProfiles(N_Vector cc, N_Vector sc)
{
  int i, jx, jy;
  sunrealtype *cloc, *sloc;
  sunrealtype ctemp[NUM_SPECIES], stemp[NUM_SPECIES];

  /* Initialize arrays ctemp and stemp used in the loading process */
  for (i = 0; i < NUM_SPECIES / 2; i++)
  {
    ctemp[i] = PREYIN;
    stemp[i] = ONE;
  }
  for (i = NUM_SPECIES / 2; i < NUM_SPECIES; i++)
  {
    ctemp[i] = PREDIN;
    stemp[i] = SUN_RCONST(0.00001);
  }

  /* Load initial profiles into cc and sc vector from ctemp and stemp. */
  for (jy = 0; jy < MY; jy++)
  {
    for (jx = 0; jx < MX; jx++)
    {
      cloc = IJ_Vptr(cc, jx, jy);
      sloc = IJ_Vptr(sc, jx, jy);
      for (i = 0; i < NUM_SPECIES; i++)
      {
        cloc[i] = ctemp[i];
        sloc[i] = stemp[i];
      }
    }
  }
}